

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

char * lj_str_find(char *s,char *p,MSize slen,MSize plen)

{
  char *__s1;
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint local_34;
  
  if (plen <= slen) {
    if (plen == 0) {
      return s;
    }
    bVar1 = *p;
    uVar4 = slen - (plen - 1);
    while (uVar4 != 0) {
      local_34 = (uint)bVar1;
      pcVar3 = (char *)memchr(s,local_34,(ulong)uVar4);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      __s1 = pcVar3 + 1;
      iVar2 = bcmp(__s1,p + 1,(ulong)(plen - 1));
      if (iVar2 == 0) {
        return pcVar3;
      }
      uVar4 = uVar4 + ((int)s - (int)__s1);
      s = __s1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_str_find(const char *s, const char *p, MSize slen, MSize plen)
{
  if (plen <= slen) {
    if (plen == 0) {
      return s;
    } else {
      int c = *(const uint8_t *)p++;
      plen--; slen -= plen;
      while (slen) {
	const char *q = (const char *)memchr(s, c, slen);
	if (!q) break;
	if (memcmp(q+1, p, plen) == 0) return q;
	q++; slen -= (MSize)(q-s); s = q;
      }
    }
  }
  return NULL;
}